

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall
StatisticsWriter::writeMatrix<double>
          (StatisticsWriter *this,ostream *stream,MultivariateTracker *tracker,string *title,
          offset_in_MultivariateTracker_to_subr matrix)

{
  long *plVar1;
  pointer pSVar2;
  long lVar3;
  char cVar4;
  ios iVar5;
  ulong uVar6;
  ostream *poVar7;
  code *pcVar8;
  pointer plVar9;
  long j;
  long lVar10;
  size_type sVar11;
  ios *this_00;
  long in_R9;
  size_type sVar12;
  long lVar13;
  size_type __n;
  ulong uVar14;
  double dVar15;
  string header;
  vector<long,_std::allocator<long>_> width;
  double d;
  string indent;
  string footer;
  char *local_290;
  long local_288;
  char local_280;
  undefined1 uStack_27f;
  undefined1 uStack_27e;
  undefined1 uStack_27d;
  undefined4 uStack_27c;
  long *local_270;
  long local_268;
  long local_260 [2];
  vector<long,_std::allocator<long>_> local_250;
  long local_238;
  double local_230;
  long *local_228;
  long local_220;
  long local_218 [2];
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  long local_1c8;
  string *local_1c0;
  long *local_1b8;
  long local_1b0;
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_1c8 = ((long)(tracker->_statistics).
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(tracker->_statistics).
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * 0x34f72c234f72c235;
  __n = (size_type)(int)local_1c8;
  local_1b8 = (long *)0x0;
  local_238 = in_R9;
  local_1c0 = title;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_250,__n,(value_type_conflict2 *)&local_1b8,(allocator_type *)&local_270);
  if (0 < (long)__n) {
    lVar10 = 0x16;
    lVar13 = 0;
    sVar12 = __n;
    do {
      pSVar2 = (tracker->_statistics).
               super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      lVar3 = *(long *)((long)pSVar2 + lVar10 * 8 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,lVar3,(&pSVar2->_count)[lVar10] + lVar3);
      StringParser::updateWidthString
                (&local_1e8,
                 (long *)((long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar13));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      lVar10 = lVar10 + 0x1d;
      lVar13 = lVar13 + 8;
      sVar12 = sVar12 - 1;
    } while (sVar12 != 0);
  }
  if (0 < (long)__n) {
    plVar1 = (long *)((long)&(tracker->_covariance).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start + local_238);
    sVar12 = 0;
    do {
      lVar10 = 0;
      sVar11 = 0;
      do {
        pcVar8 = (code *)matrix;
        if ((matrix & 1) != 0) {
          pcVar8 = *(code **)(*plVar1 + -1 + matrix);
        }
        dVar15 = (double)(*pcVar8)(plVar1,sVar12,sVar11);
        StringParser::updateWidthNumber<double>
                  (dVar15,(long *)((long)local_250.super__Vector_base<long,_std::allocator<long>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar10));
        sVar11 = sVar11 + 1;
        lVar10 = lVar10 + 8;
      } while (__n != sVar11);
      sVar12 = sVar12 + 1;
    } while (sVar12 != __n);
  }
  uVar6 = 0;
  for (plVar9 = local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_start;
      plVar9 != local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_finish; plVar9 = plVar9 + 1) {
    lVar10 = *plVar9;
    *plVar9 = lVar10 + 3;
    uVar6 = uVar6 + lVar10 + 3;
  }
  uVar14 = 0x14;
  if (0x14 < (long)uVar6) {
    uVar14 = uVar6;
  }
  local_270 = local_260;
  std::__cxx11::string::_M_construct((string *)&local_270,uVar14,'=');
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct((string *)&local_208,uVar14,'-');
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_270,local_268);
  cVar4 = std::ios::widen((ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18)),'\n');
  poVar7 = (ostream *)std::ostream::put(poVar7,cVar4);
  std::ostream::flush(poVar7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  this_00 = (ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18));
  if (poVar7[*(long *)(*(long *)poVar7 + -0x18) + 0xe1] == (ostream)0x0) {
    iVar5 = (ios)std::ios::widen(this_00,' ');
    this_00[0xe0] = iVar5;
    this_00[0xe1] = (ios)0x1;
  }
  this_00[0xe0] = (ios)0x20;
  *(long *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = (long)(int)(uVar14 >> 1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(local_1c0->_M_dataplus)._M_p,local_1c0->_M_string_length);
  cVar4 = std::ios::widen((ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18)),'\n');
  poVar7 = (ostream *)std::ostream::put(poVar7,cVar4);
  std::ostream::flush(poVar7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                      (this->_comment)._M_string_length);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_270,local_268);
  cVar4 = std::ios::widen((ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18)),'\n');
  poVar7 = (ostream *)std::ostream::put(poVar7,cVar4);
  std::ostream::flush(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)stream,(this->_comment)._M_dataplus._M_p,(this->_comment)._M_string_length);
  if ((int)local_1c8 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,"No Data",7);
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar7 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar7);
  }
  else {
    if (0 < (long)__n) {
      lVar10 = 0x16;
      sVar12 = 0;
      do {
        lVar13 = *(long *)stream;
        lVar3 = *(long *)(lVar13 + -0x18);
        *(uint *)(stream + lVar3 + 0x18) = *(uint *)(stream + lVar3 + 0x18) & 0xffffff4f | 0x80;
        *(long *)(stream + *(long *)(lVar13 + -0x18) + 0x10) =
             (long)(int)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar12];
        pSVar2 = (tracker->_statistics).
                 super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = *(long *)((long)pSVar2 + lVar10 * 8 + -8);
        local_1b8 = local_1a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,lVar13,(&pSVar2->_count)[lVar10] + lVar13);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)stream,(char *)local_1b8,local_1b0);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        sVar12 = sVar12 + 1;
        lVar10 = lVar10 + 0x1d;
      } while (__n != sVar12);
    }
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar7 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)stream,(this->_comment)._M_dataplus._M_p,
                        (this->_comment)._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)local_208,local_200);
    cVar4 = std::ios::widen((ios *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18)),'\n');
    poVar7 = (ostream *)std::ostream::put(poVar7,cVar4);
    std::ostream::flush(poVar7);
    local_228 = local_218;
    std::__cxx11::string::_M_construct((string *)&local_228,(this->_comment)._M_string_length,' ');
    if (0 < (long)__n) {
      plVar1 = (long *)((long)&(tracker->_covariance).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + local_238);
      sVar12 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)stream,(char *)local_228,local_220);
        sVar11 = 0;
        do {
          lVar10 = *(long *)stream;
          lVar13 = *(long *)(lVar10 + -0x18);
          *(uint *)(stream + lVar13 + 0x18) = *(uint *)(stream + lVar13 + 0x18) & 0xffffff4f | 0x80;
          *(long *)(stream + *(long *)(lVar10 + -0x18) + 0x10) =
               (long)(int)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start[sVar11];
          pcVar8 = (code *)matrix;
          if ((matrix & 1) != 0) {
            pcVar8 = *(code **)(*plVar1 + -1 + matrix);
          }
          dVar15 = (double)(*pcVar8)(plVar1,sVar12,sVar11);
          local_290 = &local_280;
          local_230 = dVar15;
          if (NAN(dVar15)) {
            uStack_27e = 0x6e;
            local_280 = 'n';
            uStack_27f = 0x61;
            local_288 = 3;
            uStack_27d = 0;
          }
          else {
            local_288 = 0;
            local_280 = '\0';
            std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
            *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
                 *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xfffffefb | 4;
            std::ostream::_M_insert<double>((ostream *)local_1a8,dVar15);
            std::operator>>((istream *)&local_1b8,(string *)&local_290);
            std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)stream,local_290,local_288);
          if (local_290 != &local_280) {
            operator_delete(local_290,
                            CONCAT44(uStack_27c,
                                     CONCAT13(uStack_27d,
                                              CONCAT12(uStack_27e,CONCAT11(uStack_27f,local_280))))
                            + 1);
          }
          sVar11 = sVar11 + 1;
        } while (__n != sVar11);
        cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
        poVar7 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
        std::ostream::flush(poVar7);
        sVar12 = sVar12 + 1;
      } while (sVar12 != __n);
    }
    cVar4 = std::ios::widen((ios *)(stream + *(long *)(*(long *)stream + -0x18)),'\n');
    poVar7 = (ostream *)std::ostream::put((ostream *)stream,cVar4);
    std::ostream::flush(poVar7);
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if (local_270 != local_260) {
    operator_delete(local_270,local_260[0] + 1);
  }
  if (local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
    writeMatrix(std::ostream & stream,
                MultivariateTracker & tracker,
                std::string const & title,
                T (MultivariateTracker::*matrix)(long const i, long const j) const)
    {

        int numDim = tracker.getDimension();

        // Compute column widths
        std::vector<long> width(numDim,0);
        for (long i = 0; i < numDim; i++)
        {
            StringParser::updateWidthString(tracker.getName(i), width[i]);
        }
        for (long i = 0; i < numDim; i++)
        {
            for (long j = 0; j < numDim; j++)
            {
                StringParser::updateWidthNumber<T>((tracker.*matrix)(i,j), width[j]);
            }
        }

        long totalWidth = 0;
        for (std::vector<long>::iterator it = width.begin(); it != width.end(); ++it)
        {
            (*it) += 3;
            totalWidth += *it;
        }
        totalWidth = std::max<long>(totalWidth, 20);

        // Print data headers
        std::string header(totalWidth,'='); 
        std::string footer(totalWidth,'-'); 
        stream << this->_comment << header << std::endl;
        stream << this->_comment << std::setfill (' ') << std::setw (totalWidth/2) << title << std::endl;
        stream << this->_comment << header << std::endl;
        stream << this->_comment;
        if (numDim == 0)
        {
            stream << "No Data" << std::endl;
            return;
        }
        for (long i = 0; i < numDim; i++)
        {
            stream << std::right << std::setw(width[i]) << tracker.getName(i);
        }
        stream << std::endl;
        stream << this->_comment << footer << std::endl;

        // Print data
        std::string indent(this->_comment.size(),' '); 
        for (long i = 0; i < numDim; i++)
        {
            stream << indent;
            for (long j = 0; j < numDim; j++)
            {
                stream << std::right << std::setw(width[j]) << StringParser::parseNumber<T>((tracker.*matrix)(i,j));
            }
            stream << std::endl;
        }
        stream << std::endl;
    
        return;
        
    }